

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

void ary::fillPolygon(Mat *image,
                     vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *points,
                     Scalar *value)

{
  pointer pPVar1;
  pointer pPVar2;
  long lVar3;
  long lVar4;
  Point_<int> PVar5;
  int mask_npoints;
  Point *mask_points_ptr;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> mask_points;
  undefined8 local_40;
  undefined4 local_38 [2];
  Mat *local_30;
  undefined8 local_28;
  
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            (&mask_points,
             (long)(points->
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(points->
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_38);
  pPVar1 = (points->super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (points->super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pPVar2 - (long)pPVar1 >> 3;
  mask_npoints = (int)lVar3;
  if (pPVar2 != pPVar1) {
    lVar4 = 0;
    do {
      PVar5.x = (int)pPVar1[lVar4].x;
      PVar5.y = (int)pPVar1[lVar4].y;
      mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] = PVar5;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  mask_points_ptr =
       mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28 = 0;
  local_38[0] = 0x3010000;
  local_40 = 0;
  local_30 = image;
  cv::fillPoly(local_38,&mask_points_ptr,&mask_npoints,1,value,8,0,&local_40);
  if (mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(mask_points.
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fillPolygon(Mat& image, const vector<Point2f>& points, Scalar value) {

	vector<Point> mask_points(points.size());
	int mask_npoints = points.size();
	for (int i = 0; i < points.size(); i++) {
		mask_points[i] = Point(points[i].x, points[i].y);
	}
	const Point* mask_points_ptr = &(mask_points[0]);
	fillPoly(image, &mask_points_ptr, &mask_npoints, 1, value);

}